

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O2

void LinkedReadsDatastore::build_from_fastq
               (string *output_filename,string *default_name,string *read1_filename,
               string *read2_filename,LinkedReadsFormat format,uint64_t readsize,size_t chunksize)

{
  void *__dest;
  uint *puVar1;
  char cVar2;
  uint uVar3;
  pointer pcVar4;
  undefined8 uVar5;
  pointer pLVar6;
  ulong uVar7;
  int i;
  int iVar8;
  ostream *poVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  char *pcVar14;
  runtime_error *prVar15;
  ulong uVar16;
  basic_ifstream<char,_std::char_traits<char>_> *c;
  undefined1 auVar17 [8];
  pointer pbVar18;
  LinkedReadData *r;
  pointer pLVar19;
  ulong __n;
  LinkedReadData *r_1;
  undefined1 *puVar20;
  undefined1 *puVar21;
  long lVar22;
  ulong uStack_7e0;
  undefined1 local_7d8 [8];
  char readbuffer [1000];
  long local_3e8;
  ofstream output;
  byte abStack_3c8 [480];
  undefined1 auStack_1e8 [8];
  vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  reads_in_node;
  undefined1 auStack_1c8 [8];
  vector<LinkedReadData,_std::allocator<LinkedReadData>_> next_in_chunk;
  LinkedReadData currrent_read;
  undefined1 auStack_158 [8];
  vector<long,_std::allocator<long>_> read_to_node;
  undefined1 auStack_128 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> read_tag;
  size_type local_108;
  LinkedTag (*__range2) [758408];
  vector<LinkedReadData,_std::allocator<LinkedReadData>_> readdatav;
  undefined2 local_c2;
  uint64_t uStack_c0;
  SDG_FILETYPE type;
  uint64_t readsize_local;
  string local_98;
  long local_78;
  long local_70;
  undefined1 local_68 [8];
  LinkedTag mintag;
  undefined1 auStack_48 [8];
  vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  chunkfiles;
  
  auStack_128 = (undefined1  [8])0x0;
  read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  currrent_read.seq2.field_2._8_8_ = default_name;
  uStack_c0 = readsize;
  poVar9 = sdglib::OutputLog(INFO,true);
  poVar9 = std::operator<<(poVar9,"Creating Datastore Index from ");
  poVar9 = std::operator<<(poVar9,(string *)read1_filename);
  poVar9 = std::operator<<(poVar9," | ");
  poVar9 = std::operator<<(poVar9,(string *)read2_filename);
  std::endl<char,std::char_traits<char>>(poVar9);
  local_78 = gzopen((read1_filename->_M_dataplus)._M_p,"r");
  if (local_78 == 0) {
    poVar9 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
    poVar9 = std::operator<<(poVar9,(string *)read1_filename);
    poVar9 = std::operator<<(poVar9,": ");
    piVar13 = __errno_location();
    pcVar14 = strerror(*piVar13);
    std::operator<<(poVar9,pcVar14);
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7d8,
                   "Could not open ",read1_filename);
    std::runtime_error::runtime_error(prVar15,(string *)local_7d8);
    __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_70 = gzopen((read2_filename->_M_dataplus)._M_p,"r");
  if (local_70 == 0) {
    poVar9 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
    poVar9 = std::operator<<(poVar9,(string *)read2_filename);
    poVar9 = std::operator<<(poVar9,": ");
    piVar13 = __errno_location();
    pcVar14 = strerror(*piVar13);
    std::operator<<(poVar9,pcVar14);
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7d8,
                   "Could not open ",read2_filename);
    std::runtime_error::runtime_error(prVar15,(string *)local_7d8);
    __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar9 = sdglib::OutputLog(INFO,true);
  poVar9 = std::operator<<(poVar9,"Building tag sorted chunks of ");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  poVar9 = std::operator<<(poVar9," pairs");
  std::endl<char,std::char_traits<char>>(poVar9);
  __range2 = (LinkedTag (*) [758408])0x0;
  readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::reserve
            ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)&__range2,chunksize);
  chunkfiles.
  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_48 = (undefined1  [8])0x0;
  chunkfiles.
  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  auStack_1c8 = (undefined1  [8])0x0;
  next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  currrent_read._0_8_ = &currrent_read.seq1._M_string_length;
  currrent_read.seq1._M_dataplus._M_p = (pointer)0x0;
  currrent_read.seq1._M_string_length._0_1_ = 0;
  currrent_read.seq1.field_2._8_8_ = &currrent_read.seq2._M_string_length;
  currrent_read.seq2._M_dataplus._M_p = (pointer)0x0;
  local_108 = 0;
  currrent_read.seq2._M_string_length._0_1_ = 0;
LAB_001d48e4:
  while( true ) {
    iVar8 = gzeof(local_78);
    if ((iVar8 != 0) || (iVar8 = gzeof(local_70), iVar8 != 0)) {
      if (readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)__range2) {
        std::
        __sort<__gnu_cxx::__normal_iterator<LinkedReadData*,std::vector<LinkedReadData,std::allocator<LinkedReadData>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ();
        std::__cxx11::to_string
                  (&local_98,
                   ((long)chunkfiles.
                          super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) / 0x208);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &readsize_local,"sorted_chunk_",&local_98);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &readsize_local,".data");
        std::ofstream::ofstream(&local_3e8,(string *)local_68,_S_out);
        std::__cxx11::string::~string((string *)local_68);
        std::__cxx11::string::~string((string *)&readsize_local);
        std::__cxx11::string::~string((string *)&local_98);
        poVar9 = sdglib::OutputLog(INFO,true);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9," pairs dumping on chunk ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::endl<char,std::char_traits<char>>(poVar9);
        if ((abStack_3c8[*(long *)(local_3e8 + -0x18)] & 5) != 0) {
          poVar9 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
          std::__cxx11::to_string
                    (&local_98,
                     ((long)chunkfiles.
                            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) / 0x208);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &readsize_local,"sorted_chunk_",&local_98);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&readsize_local,".data");
          poVar9 = std::operator<<(poVar9,(string *)local_68);
          poVar9 = std::operator<<(poVar9,": ");
          piVar13 = __errno_location();
          pcVar14 = strerror(*piVar13);
          std::operator<<(poVar9,pcVar14);
          std::__cxx11::string::~string((string *)local_68);
          std::__cxx11::string::~string((string *)&readsize_local);
          std::__cxx11::string::~string((string *)&local_98);
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string
                    ((string *)auStack_158,
                     ((long)chunkfiles.
                            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) / 0x208);
          std::operator+(&local_98,"sorted_chunk_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_158);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &readsize_local,&local_98,".data");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68,"Could not open ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &readsize_local);
          std::runtime_error::runtime_error(prVar15,(string *)local_68);
          __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        poVar9 = sdglib::OutputLog(INFO,true);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9," pairs dumping on chunk ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::endl<char,std::char_traits<char>>(poVar9);
        pLVar6 = readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar11 = uStack_c0 * 2 + 0x11 & 0xfffffffffffffff0;
        lVar10 = -uVar11;
        puVar21 = local_7d8 + lVar10;
        for (pLVar19 = (pointer)__range2; pLVar19 != pLVar6; pLVar19 = pLVar19 + 1) {
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 4;
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5213;
          std::ostream::write((char *)&local_3e8,(long)pLVar19);
          uVar7 = uStack_c0;
          lVar12 = uStack_c0 * 2;
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d522f;
          memset(puVar21,0,lVar12 + 2);
          pcVar4 = (pLVar19->seq1)._M_dataplus._M_p;
          uVar16 = (pLVar19->seq1)._M_string_length;
          if (uVar7 <= uVar16) {
            uVar16 = uVar7;
          }
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5246;
          memcpy(puVar21,pcVar4,uVar16);
          pcVar4 = (pLVar19->seq2)._M_dataplus._M_p;
          uVar16 = (pLVar19->seq2)._M_string_length;
          __n = uVar7;
          if (uVar16 < uVar7) {
            __n = uVar16;
          }
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5268;
          memcpy(local_7d8 + (uVar7 - uVar11) + 1,pcVar4,__n);
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5276;
          std::ostream::write((char *)&local_3e8,(long)puVar21);
        }
        *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5288;
        std::ofstream::close();
        lVar12 = (long)chunkfiles.
                       super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48;
        *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d52a9;
        std::__cxx11::to_string(&local_98,lVar12 / 0x208);
        *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d52c3;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &readsize_local,"sorted_chunk_",&local_98);
        *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d52da;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &readsize_local,".data");
        *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d52e7;
        std::vector<std::ifstream,std::allocator<std::ifstream>>::emplace_back<std::__cxx11::string>
                  ((vector<std::ifstream,std::allocator<std::ifstream>> *)auStack_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
        *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d52f0;
        std::__cxx11::string::~string((string *)local_68);
        *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d52fc;
        std::__cxx11::string::~string((string *)&readsize_local);
        *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5308;
        std::__cxx11::string::~string((string *)&local_98);
        if (((byte)chunkfiles.
                   super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*(long *)(*(long *)(chunkfiles.
                                        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + -0x208) + -0x18)
                    + -0x1e8] & 5) != 0) {
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5f4b;
          poVar9 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
          lVar12 = (long)chunkfiles.
                         super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48;
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5f6f;
          std::__cxx11::to_string(&local_98,lVar12 / 0x208);
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5f89;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &readsize_local,"sorted_chunk_",&local_98);
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5fa0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&readsize_local,".data");
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5fac;
          poVar9 = std::operator<<(poVar9,(string *)local_68);
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5fbb;
          poVar9 = std::operator<<(poVar9,": ");
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5fc3;
          piVar13 = __errno_location();
          iVar8 = *piVar13;
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5fca;
          pcVar14 = strerror(iVar8);
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5fd5;
          std::operator<<(poVar9,pcVar14);
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5fde;
          std::__cxx11::string::~string((string *)local_68);
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5fea;
          std::__cxx11::string::~string((string *)&readsize_local);
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5ff6;
          std::__cxx11::string::~string((string *)&local_98);
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x10;
          uVar5 = *(undefined8 *)((long)&uStack_7e0 + lVar10);
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5ffe;
          prVar15 = (runtime_error *)__cxa_allocate_exception(uVar5);
          lVar12 = (long)chunkfiles.
                         super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48;
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d6022;
          std::__cxx11::to_string((string *)auStack_158,lVar12 / 0x208);
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d603c;
          std::operator+(&local_98,"sorted_chunk_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_158);
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d6056;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &readsize_local,&local_98,".data");
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d606d;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68,"Could not open ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &readsize_local);
          *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d607c;
          std::runtime_error::runtime_error(prVar15,(string *)local_68);
          *(undefined1 **)((long)&uStack_7e0 + lVar10) = &LAB_001d6095;
          __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5331;
        std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::clear
                  ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)&__range2);
        *(undefined8 *)((long)&uStack_7e0 + lVar10) = 1;
        uVar5 = *(undefined8 *)((long)&uStack_7e0 + lVar10);
        *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d533b;
        poVar9 = sdglib::OutputLog(INFO,SUB81(uVar5,0));
        *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d534a;
        poVar9 = std::operator<<(poVar9,"dumped!");
        *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5352;
        std::endl<char,std::char_traits<char>>(poVar9);
        std::ofstream::~ofstream(&local_3e8);
      }
      poVar9 = sdglib::OutputLog(INFO,true);
      poVar9 = std::operator<<(poVar9,"performing merge from disk");
      std::endl<char,std::char_traits<char>>(poVar9);
      std::ofstream::ofstream(&local_3e8,(output_filename->_M_dataplus)._M_p,_S_out);
      if ((abStack_3c8[*(long *)(local_3e8 + -0x18)] & 5) == 0) {
        std::ostream::write((char *)&local_3e8,0x251016);
        std::ostream::write((char *)&local_3e8,0x251018);
        local_c2 = 3;
        std::ostream::write((char *)&local_3e8,(long)&local_c2);
        sdglib::write_string((ofstream *)&local_3e8,(string *)currrent_read.seq2.field_2._8_8_);
        std::ostream::write((char *)&local_3e8,(long)&stack0xffffffffffffff40);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_128,local_108);
        poVar9 = sdglib::OutputLog(INFO,true);
        poVar9 = std::operator<<(poVar9,"leaving space for ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9," read_tag entries");
        std::endl<char,std::char_traits<char>>(poVar9);
        sdglib::write_flat_vector<unsigned_int>
                  ((ofstream *)&local_3e8,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_128);
        lVar10 = ((long)chunkfiles.
                        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) / 0x208;
        read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(read_tag.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(int)lVar10);
        puVar20 = local_7d8 + -(lVar10 * 4 + 0xfU & 0xfffffffffffffff0);
        lVar22 = (long)puVar20 - (uStack_c0 * 2 + 0x11 & 0xfffffffffffffff0);
        lVar12 = 0;
        *(undefined8 *)(lVar22 + -8) = 4;
        puVar21 = puVar20;
        for (uVar11 = 0;
            pbVar18 = chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, auVar17 = auStack_48,
            uVar11 < (ulong)(((long)chunkfiles.
                                    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) /
                            0x208); uVar11 = uVar11 + 1) {
          pbVar18 = (pointer)((long)auStack_48 + lVar12);
          *(undefined8 *)(lVar22 + -8) = 0x1d551f;
          std::istream::read((char *)pbVar18,(long)puVar21);
          puVar21 = puVar21 + 4;
          lVar12 = lVar12 + 0x208;
        }
        if ((undefined1  [8])
            read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != auStack_128) {
          read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)auStack_128;
        }
        *(undefined8 *)(lVar22 + -8) = 4;
        while ((int)read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage != 0) {
          local_68._0_4_ = 0xffffffff;
          *(undefined8 *)(lVar22 + -8) = 0xffffffffffffffff;
          uVar11 = *(ulong *)(lVar22 + -8);
          for (lVar12 = 0; lVar10 << 2 != lVar12; lVar12 = lVar12 + 4) {
            uVar3 = *(uint *)(puVar20 + lVar12);
            if (uVar3 < (uint)uVar11) {
              uVar11 = (ulong)uVar3;
              local_68._0_4_ = uVar3;
            }
          }
          for (uVar11 = 0; uVar11 < (ulong)(((long)pbVar18 - (long)auVar17) / 0x208);
              uVar11 = uVar11 + 1) {
            puVar1 = (uint *)(puVar20 + uVar11 * 4);
            lVar12 = uVar11 * 0x208;
            while ((((byte)((pointer)((long)auVar17 + lVar12))
                           [*(long *)(*(long *)((long)auVar17 + lVar12) + -0x18) + 0x20] & 2) == 0
                   && (*puVar1 == local_68._0_4_))) {
              *(undefined8 *)(lVar22 + -8) = 0x1d55f7;
              std::istream::read((char *)((long)auVar17 + lVar12),lVar22);
              *(undefined8 *)(lVar22 + -8) = 0x1d5615;
              std::ostream::write((char *)&local_3e8,lVar22);
              *(undefined8 *)(lVar22 + -8) = 0x1d5624;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_128,
                         (value_type_conflict5 *)local_68);
              pbVar18 = (pointer)((long)auStack_48 + lVar12);
              *(undefined8 *)(lVar22 + -8) = 0x1d5636;
              std::istream::read((char *)pbVar18,(long)puVar1);
              auVar17 = auStack_48;
              if (((byte)*(pointer)((long)auStack_48 +
                                   *(long *)(*(long *)((long)auStack_48 + lVar12) + -0x18) + 0x20 +
                                   lVar12) & 2) != 0) {
                *puVar1 = 0xffffffff;
                *(undefined8 *)(lVar22 + -8) = 1;
                uVar5 = *(undefined8 *)(lVar22 + -8);
                *(undefined8 *)(lVar22 + -8) = 0x1d5660;
                poVar9 = sdglib::OutputLog(INFO,SUB81(uVar5,0));
                *(undefined8 *)(lVar22 + -8) = 0x1d566f;
                poVar9 = std::operator<<(poVar9,"chunk ");
                *(undefined8 *)(lVar22 + -8) = 0x1d567e;
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)uVar11);
                *(undefined8 *)(lVar22 + -8) = 0x1d568d;
                poVar9 = std::operator<<(poVar9," finished");
                *(undefined8 *)(lVar22 + -8) = 0x1d5695;
                std::endl<char,std::char_traits<char>>(poVar9);
                read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)CONCAT44(read_tag.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                       (int)read_tag.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + -1)
                ;
                auVar17 = auStack_48;
              }
            }
            pbVar18 = chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        *(undefined8 *)(lVar22 + -8) = 2;
        *(undefined8 *)(lVar22 + -8) = 0x1d56d4;
        std::ostream::write((char *)&local_3e8,0x251016);
        *(undefined8 *)(lVar22 + -8) = 2;
        *(undefined8 *)(lVar22 + -8) = 0x1d56ea;
        std::ostream::write((char *)&local_3e8,0x251018);
        local_c2 = 6;
        *(undefined8 *)(lVar22 + -8) = 2;
        *(undefined8 *)(lVar22 + -8) = 0x1d5705;
        std::ostream::write((char *)&local_3e8,(long)&local_c2);
        auStack_158 = (undefined1  [8])0x0;
        read_to_node.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        read_to_node.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        *(undefined8 *)(lVar22 + -8) = 0x1d5723;
        sdglib::write_flat_vector<long>
                  ((ofstream *)&local_3e8,(vector<long,_std::allocator<long>_> *)auStack_158);
        auStack_1e8 = (undefined1  [8])0x0;
        reads_in_node.
        super__Vector_base<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        reads_in_node.
        super__Vector_base<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)(lVar22 + -8) = 0x1d5741;
        sdglib::write_flat_vectorvector<ReadMapping>
                  ((ofstream *)&local_3e8,
                   (vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
                    *)auStack_1e8);
        lVar10 = *(long *)(currrent_read.seq2.field_2._8_8_ + 8);
        *(undefined8 *)(lVar22 + -8) = 0x1d575e;
        std::ostream::seekp(&local_3e8,lVar10 + 0x16,0);
        *(undefined8 *)(lVar22 + -8) = 1;
        uVar5 = *(undefined8 *)(lVar22 + -8);
        *(undefined8 *)(lVar22 + -8) = 0x1d5768;
        poVar9 = sdglib::OutputLog(INFO,SUB81(uVar5,0));
        *(undefined8 *)(lVar22 + -8) = 0x1d5777;
        poVar9 = std::operator<<(poVar9,"writing down ");
        *(undefined8 *)(lVar22 + -8) = 0x1d5786;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        *(undefined8 *)(lVar22 + -8) = 0x1d5795;
        poVar9 = std::operator<<(poVar9," read_tag entries");
        *(undefined8 *)(lVar22 + -8) = 0x1d579d;
        std::endl<char,std::char_traits<char>>(poVar9);
        *(undefined8 *)(lVar22 + -8) = 0x1d57b0;
        sdglib::write_flat_vector<unsigned_int>
                  ((ofstream *)&local_3e8,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_128);
        *(undefined8 *)(lVar22 + -8) = 0x1d57bc;
        std::ofstream::close();
        pbVar18 = chunkfiles.
                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        for (auVar17 = auStack_48; auVar17 != (undefined1  [8])pbVar18;
            auVar17 = (undefined1  [8])((long)auVar17 + 0x208)) {
          *(undefined8 *)(lVar22 + -8) = 0x1d57d1;
          std::ifstream::close();
        }
        for (uVar11 = 0;
            uVar11 < (ulong)(((long)chunkfiles.
                                    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) /
                            0x208); uVar11 = uVar11 + 1) {
          *(undefined8 *)(lVar22 + -8) = 0x1d5816;
          std::__cxx11::to_string(&local_98,(int)uVar11);
          *(undefined8 *)(lVar22 + -8) = 0x1d5828;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &readsize_local,"sorted_chunk_",&local_98);
          *(undefined8 *)(lVar22 + -8) = 0x1d5836;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&readsize_local,".data");
          pcVar14 = (char *)CONCAT44(local_68._4_4_,local_68._0_4_);
          *(undefined8 *)(lVar22 + -8) = 0x1d583f;
          unlink(pcVar14);
          *(undefined8 *)(lVar22 + -8) = 0x1d5847;
          std::__cxx11::string::~string((string *)local_68);
          *(undefined8 *)(lVar22 + -8) = 0x1d584f;
          std::__cxx11::string::~string((string *)&readsize_local);
          *(undefined8 *)(lVar22 + -8) = 0x1d5857;
          std::__cxx11::string::~string((string *)&local_98);
        }
        *(undefined8 *)(lVar22 + -8) = 1;
        uVar5 = *(undefined8 *)(lVar22 + -8);
        *(undefined8 *)(lVar22 + -8) = 0x1d5866;
        poVar9 = sdglib::OutputLog(INFO,SUB81(uVar5,0));
        *(undefined8 *)(lVar22 + -8) = 0x1d5875;
        poVar9 = std::operator<<(poVar9,"Datastore with ");
        *(undefined8 *)(lVar22 + -8) = 0x1d588e;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        *(undefined8 *)(lVar22 + -8) = 0x1d589d;
        poVar9 = std::operator<<(poVar9," reads, ");
        *(undefined8 *)(lVar22 + -8) = 0x1d58ac;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        *(undefined8 *)(lVar22 + -8) = 0x1d58bb;
        poVar9 = std::operator<<(poVar9," reads with tags");
        *(undefined8 *)(lVar22 + -8) = 0x1d58c3;
        std::endl<char,std::char_traits<char>>(poVar9);
        lVar10 = local_78;
        *(undefined8 *)(lVar22 + -8) = 0x1d58cc;
        gzclose(lVar10);
        lVar10 = local_70;
        *(undefined8 *)(lVar22 + -8) = 0x1d58d5;
        gzclose(lVar10);
        *(undefined8 *)(lVar22 + -8) = 0x1d58e1;
        std::
        vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
        ::~vector((vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
                   *)auStack_1e8);
        *(undefined8 *)(lVar22 + -8) = 0x1d58ed;
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  ((_Vector_base<long,_std::allocator<long>_> *)auStack_158);
        std::ofstream::~ofstream(&local_3e8);
        LinkedReadData::~LinkedReadData
                  ((LinkedReadData *)
                   &next_in_chunk.
                    super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::~vector
                  ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)auStack_1c8);
        std::
        vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
        ::~vector((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                   *)auStack_48);
        std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::~vector
                  ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)&__range2);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_128);
        return;
      }
      poVar9 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
      poVar9 = std::operator<<(poVar9,(string *)output_filename);
      poVar9 = std::operator<<(poVar9,": ");
      piVar13 = __errno_location();
      pcVar14 = strerror(*piVar13);
      std::operator<<(poVar9,pcVar14);
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     "Could not open ",output_filename);
      std::runtime_error::runtime_error(prVar15,(string *)local_68);
      __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (format == raw) goto LAB_001d4973;
    if (format != UCDavis) break;
    lVar10 = gzgets(local_78,local_7d8,999);
    if (lVar10 != 0) {
      next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      for (lVar10 = 1; lVar10 != 0x11; lVar10 = lVar10 + 1) {
        next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage << 2;
        cVar2 = local_7d8[lVar10];
        if (cVar2 != 'A') {
          if (cVar2 == 'T') {
            next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (uint)next_in_chunk.
                       super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage | 3;
          }
          else if (cVar2 == 'G') {
            next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (uint)next_in_chunk.
                       super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage | 2;
          }
          else {
            if (cVar2 != 'C') {
              next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              break;
            }
            next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (uint)next_in_chunk.
                       super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage | 1;
          }
        }
      }
      lVar10 = gzgets(local_78,local_7d8,999);
      if (lVar10 != 0) {
        std::__cxx11::string::string((string *)&local_3e8,local_7d8,(allocator *)local_68);
        std::__cxx11::string::operator=((string *)&currrent_read,(string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_3e8);
        if (currrent_read.seq1._M_dataplus._M_p[currrent_read._0_8_ + -1] == '\n') {
          std::__cxx11::string::resize((ulong)&currrent_read);
        }
        lVar10 = gzgets(local_78,local_7d8,999);
        if (((lVar10 != 0) && (lVar10 = gzgets(local_78,local_7d8,999), lVar10 != 0)) &&
           ((lVar10 = gzgets(local_70,local_7d8,999), lVar10 != 0 &&
            (lVar10 = gzgets(local_70,local_7d8,999), lVar10 != 0)))) {
          std::__cxx11::string::string((string *)&local_3e8,local_7d8,(allocator *)local_68);
          std::__cxx11::string::operator=
                    ((string *)(currrent_read.seq1.field_2._M_local_buf + 8),(string *)&local_3e8);
          std::__cxx11::string::~string((string *)&local_3e8);
          if (currrent_read.seq2._M_dataplus._M_p[currrent_read.seq1.field_2._8_8_ + -1] == '\n') {
            std::__cxx11::string::resize((ulong)((long)&currrent_read.seq1.field_2 + 8));
          }
          lVar10 = gzgets(local_70,local_7d8,999);
          if (lVar10 != 0) {
            lVar10 = gzgets(local_70,local_7d8,999);
            goto LAB_001d4caf;
          }
        }
      }
    }
  }
  goto LAB_001d4cc4;
LAB_001d4973:
  lVar10 = gzgets(local_78,local_7d8,999);
  if ((lVar10 != 0) && (lVar10 = gzgets(local_78,local_7d8,999), lVar10 != 0)) {
    next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage << 2;
      cVar2 = local_7d8[lVar10];
      if (cVar2 != 'A') {
        if (cVar2 == 'T') {
          next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (uint)next_in_chunk.
                     super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage | 3;
        }
        else if (cVar2 == 'G') {
          next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (uint)next_in_chunk.
                     super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage | 2;
        }
        else {
          if (cVar2 != 'C') {
            next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            break;
          }
          next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (uint)next_in_chunk.
                     super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage | 1;
        }
      }
    }
    std::__cxx11::string::string((string *)&local_3e8,readbuffer + 0xf,(allocator *)local_68);
    std::__cxx11::string::operator=((string *)&currrent_read,(string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    if (currrent_read.seq1._M_dataplus._M_p[currrent_read._0_8_ + -1] == '\n') {
      std::__cxx11::string::resize((ulong)&currrent_read);
    }
    lVar10 = gzgets(local_78,local_7d8,999);
    if ((((lVar10 != 0) && (lVar10 = gzgets(local_78,local_7d8,999), lVar10 != 0)) &&
        (lVar10 = gzgets(local_70,local_7d8,999), lVar10 != 0)) &&
       (lVar10 = gzgets(local_70,local_7d8,999), lVar10 != 0)) {
      std::__cxx11::string::string((string *)&local_3e8,local_7d8,(allocator *)local_68);
      std::__cxx11::string::operator=
                ((string *)(currrent_read.seq1.field_2._M_local_buf + 8),(string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      if (currrent_read.seq2._M_dataplus._M_p[currrent_read.seq1.field_2._8_8_ + -1] == '\n') {
        std::__cxx11::string::resize((ulong)((long)&currrent_read.seq1.field_2 + 8));
      }
      lVar10 = gzgets(local_70,local_7d8,999);
      if (lVar10 != 0) {
        lVar10 = gzgets(local_70,local_7d8,999);
LAB_001d4caf:
        if (lVar10 != 0) {
LAB_001d4cc4:
          std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::push_back
                    ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)&__range2,
                     (value_type *)
                     &next_in_chunk.
                      super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          local_108 = local_108 + 1;
          if (((long)readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                     _M_impl.super__Vector_impl_data._M_start - (long)__range2) / 0x48 == chunksize)
          {
            std::
            __sort<__gnu_cxx::__normal_iterator<LinkedReadData*,std::vector<LinkedReadData,std::allocator<LinkedReadData>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (__range2,readdatav.
                                super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                       ((long)readdatav.
                              super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)__range2) % 0x48);
            std::__cxx11::to_string
                      (&local_98,
                       ((long)chunkfiles.
                              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) / 0x208)
            ;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &readsize_local,"sorted_chunk_",&local_98);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&readsize_local,".data");
            std::ofstream::ofstream((string *)&local_3e8,(string *)local_68,_S_out);
            std::__cxx11::string::~string((string *)local_68);
            std::__cxx11::string::~string((string *)&readsize_local);
            std::__cxx11::string::~string((string *)&local_98);
            poVar9 = sdglib::OutputLog(INFO,true);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            poVar9 = std::operator<<(poVar9," pairs dumping on chunk ");
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            std::endl<char,std::char_traits<char>>(poVar9);
            if ((abStack_3c8[*(long *)(local_3e8 + -0x18)] & 5) != 0) {
              poVar9 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
              std::__cxx11::to_string
                        (&local_98,
                         ((long)chunkfiles.
                                super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) /
                         0x208);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &readsize_local,"sorted_chunk_",&local_98);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&readsize_local,".data");
              poVar9 = std::operator<<(poVar9,(string *)local_68);
              poVar9 = std::operator<<(poVar9,": ");
              piVar13 = __errno_location();
              pcVar14 = strerror(*piVar13);
              std::operator<<(poVar9,pcVar14);
              std::__cxx11::string::~string((string *)local_68);
              std::__cxx11::string::~string((string *)&readsize_local);
              std::__cxx11::string::~string((string *)&local_98);
              prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::to_string
                        ((string *)auStack_158,
                         ((long)chunkfiles.
                                super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) /
                         0x208);
              std::operator+(&local_98,"sorted_chunk_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             auStack_158);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &readsize_local,&local_98,".data");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68,"Could not open ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &readsize_local);
              std::runtime_error::runtime_error(prVar15,(string *)local_68);
              __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            poVar9 = sdglib::OutputLog(INFO,true);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            poVar9 = std::operator<<(poVar9," pairs dumping on chunk ");
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            std::endl<char,std::char_traits<char>>(poVar9);
            pLVar6 = readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar11 = uStack_c0 * 2 + 0x11 & 0xfffffffffffffff0;
            lVar10 = -uVar11;
            puVar21 = local_7d8 + lVar10;
            read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)(local_7d8 + (1 - uVar11));
            for (pLVar19 = (pointer)__range2; pLVar19 != pLVar6; pLVar19 = pLVar19 + 1) {
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 4;
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d4eca;
              std::ostream::write((char *)&local_3e8,(long)pLVar19);
              uVar16 = uStack_c0;
              lVar12 = uStack_c0 * 2;
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d4ef1;
              memset(puVar21,0,lVar12 + 2);
              pcVar4 = (pLVar19->seq1)._M_dataplus._M_p;
              uVar11 = (pLVar19->seq1)._M_string_length;
              if (uVar16 <= uVar11) {
                uVar11 = uVar16;
              }
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d4f0a;
              memcpy(puVar21,pcVar4,uVar11);
              __dest = (void *)((long)read_tag.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar16);
              pcVar4 = (pLVar19->seq2)._M_dataplus._M_p;
              uVar11 = (pLVar19->seq2)._M_string_length;
              if (uVar11 < uVar16) {
                uVar16 = uVar11;
              }
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d4f35;
              memcpy(__dest,pcVar4,uVar16);
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d4f47;
              std::ostream::write((char *)&local_3e8,(long)puVar21);
            }
            *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d4f58;
            std::ofstream::close();
            lVar12 = (long)chunkfiles.
                           super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48;
            *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d4f7c;
            std::__cxx11::to_string(&local_98,lVar12 / 0x208);
            *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d4f95;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &readsize_local,"sorted_chunk_",&local_98);
            *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d4fa7;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&readsize_local,".data");
            *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d4fb3;
            std::vector<std::ifstream,std::allocator<std::ifstream>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::ifstream,std::allocator<std::ifstream>> *)auStack_48,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                      );
            *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d4fbb;
            std::__cxx11::string::~string((string *)local_68);
            *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d4fc7;
            std::__cxx11::string::~string((string *)&readsize_local);
            *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d4fd3;
            std::__cxx11::string::~string((string *)&local_98);
            if (((byte)chunkfiles.
                       super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(long *)(*(long *)(chunkfiles.
                                            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + -0x208) +
                                 -0x18) + -0x1e8] & 5) != 0) {
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5abd;
              poVar9 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
              lVar12 = (long)chunkfiles.
                             super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48;
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5ae1;
              std::__cxx11::to_string(&local_98,lVar12 / 0x208);
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5afb;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &readsize_local,"sorted_chunk_",&local_98);
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5b12;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&readsize_local,".data");
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5b1e;
              poVar9 = std::operator<<(poVar9,(string *)local_68);
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5b2d;
              poVar9 = std::operator<<(poVar9,": ");
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5b35;
              piVar13 = __errno_location();
              iVar8 = *piVar13;
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5b3c;
              pcVar14 = strerror(iVar8);
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5b47;
              std::operator<<(poVar9,pcVar14);
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5b50;
              std::__cxx11::string::~string((string *)local_68);
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5b5c;
              std::__cxx11::string::~string((string *)&readsize_local);
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5b68;
              std::__cxx11::string::~string((string *)&local_98);
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x10;
              uVar5 = *(undefined8 *)((long)&uStack_7e0 + lVar10);
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5b70;
              prVar15 = (runtime_error *)__cxa_allocate_exception(uVar5);
              lVar12 = (long)chunkfiles.
                             super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48;
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5b94;
              std::__cxx11::to_string((string *)auStack_158,lVar12 / 0x208);
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5bae;
              std::operator+(&local_98,"sorted_chunk_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             auStack_158);
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5bc8;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &readsize_local,&local_98,".data");
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5bdf;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68,"Could not open ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &readsize_local);
              *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5bee;
              std::runtime_error::runtime_error(prVar15,(string *)local_68);
              *(undefined **)((long)&uStack_7e0 + lVar10) = &UNK_001d5c07;
              __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d4ffc;
            std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::clear
                      ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)&__range2);
            *(undefined8 *)((long)&uStack_7e0 + lVar10) = 1;
            uVar5 = *(undefined8 *)((long)&uStack_7e0 + lVar10);
            *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5006;
            poVar9 = sdglib::OutputLog(INFO,SUB81(uVar5,0));
            *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d5015;
            poVar9 = std::operator<<(poVar9,"dumped!");
            *(undefined8 *)((long)&uStack_7e0 + lVar10) = 0x1d501d;
            std::endl<char,std::char_traits<char>>(poVar9);
            std::ofstream::~ofstream(&local_3e8);
          }
        }
      }
    }
  }
  goto LAB_001d48e4;
}

Assistant:

void LinkedReadsDatastore::build_from_fastq(std::string output_filename, std::string default_name, std::string read1_filename,
                                            std::string read2_filename,
                                            LinkedReadsFormat format, uint64_t readsize, size_t chunksize) {
    std::vector<uint32_t> read_tag;
    //std::cout<<"Memory used by every read's entry:"<< sizeof(LinkedRead)<<std::endl;
    //read each read, put it on the index and on the appropriate tag
    sdglib::OutputLog(sdglib::LogLevels::INFO)<<"Creating Datastore Index from "<<read1_filename<<" | "<<read2_filename<<std::endl;
    auto fd1=gzopen(read1_filename.c_str(),"r");
    if (!fd1) {
        std::cerr << "Failed to open " << read1_filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + read1_filename);
    }
    auto fd2=gzopen(read2_filename.c_str(),"r");

    if (!fd2) {
        std::cerr << "Failed to open " << read2_filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + read2_filename);
    }
    char readbuffer[1000];
    uint64_t r1offset,r2offset;
    uint64_t tagged_reads=0;
    //first, build an index of tags and offsets
    sdglib::OutputLog()<<"Building tag sorted chunks of "<<chunksize<<" pairs"<<std::endl;
    std::vector<LinkedReadData> readdatav;
    readdatav.reserve(chunksize);
    std::vector<std::ifstream> chunkfiles;
    std::vector<LinkedReadData> next_in_chunk;
    LinkedReadData currrent_read;
    //First, create the chunk files
    uint64_t pairs=0;
    while (!gzeof(fd1) and !gzeof(fd2)) {
        LinkedTag newtag = 0;
        if (format==LinkedReadsFormat::UCDavis) {
            //LinkedRead r1,r2;
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be missing a header");
            }
            //Tag to number from r1's name
            for (auto i = 1; i < 17; ++i) {
                newtag <<= 2;
                if (readbuffer[i] == 'C') newtag += 1;
                else if (readbuffer[i] == 'G') newtag += 2;
                else if (readbuffer[i] == 'T') newtag += 3;
                else if (readbuffer[i] != 'A') {
                    newtag = 0;
                    break;
                }
            }
            currrent_read.tag=newtag;
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            currrent_read.seq1=std::string(readbuffer);
            if (currrent_read.seq1.back()=='\n') currrent_read.seq1.resize(currrent_read.seq1.size()-1);
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;

            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be missing a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            currrent_read.seq2=std::string(readbuffer);
            if (currrent_read.seq2.back()=='\n') currrent_read.seq2.resize(currrent_read.seq2.size()-1);
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
        }
        else if (format==LinkedReadsFormat::raw){
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be missing a header");
            }
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            for (auto i = 0; i < 16; ++i) {
                newtag <<= 2;
                if (readbuffer[i] == 'C') newtag += 1;
                else if (readbuffer[i] == 'G') newtag += 2;
                else if (readbuffer[i] == 'T') newtag += 3;
                else if (readbuffer[i] != 'A') {
                    newtag = 0;
                    break;
                }
            }
            currrent_read.tag=newtag;
            currrent_read.seq1=std::string(readbuffer + 16 + 7);
            if (currrent_read.seq1.back()=='\n') currrent_read.seq1.resize(currrent_read.seq1.size()-1);
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;

            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be missing a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            currrent_read.seq2=std::string(readbuffer);
            if (currrent_read.seq2.back()=='\n') currrent_read.seq2.resize(currrent_read.seq2.size()-1);
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
        }
        if (0 != newtag) tagged_reads += 2;
        ++pairs;
        readdatav.push_back(currrent_read);
        if (readdatav.size()==chunksize){
            //sort
            std::sort(readdatav.begin(),readdatav.end());
            //dump
            std::ofstream ofile("sorted_chunk_"+std::to_string(chunkfiles.size())+".data");
            sdglib::OutputLog()<<readdatav.size()<<" pairs dumping on chunk "<<chunkfiles.size()<<std::endl;
            if (!ofile) {
                std::cerr << "Failed to open " << ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") <<": " << strerror(errno);
                throw std::runtime_error("Could not open " + ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") );

            }

            sdglib::OutputLog()<<readdatav.size()<<" pairs dumping on chunk "<<chunkfiles.size()<<std::endl;
            //add file to vector of files
            char buffer[2*readsize+2];
            for (auto &r:readdatav){
                ofile.write((const char * ) &r.tag,sizeof(r.tag));
                bzero(buffer,2*readsize+2);
                memcpy(buffer,r.seq1.data(),(r.seq1.size()>readsize ? readsize : r.seq1.size()));
                memcpy(buffer+readsize+1,r.seq2.data(),(r.seq2.size()>readsize ? readsize : r.seq2.size()));
                ofile.write(buffer,2*readsize+2);
            }
            ofile.close();
            chunkfiles.emplace_back("sorted_chunk_"+std::to_string(chunkfiles.size())+".data");
            if (!chunkfiles.back()) {
                std::cerr << "Failed to open " << ("sorted_chunk_"+std::to_string(chunkfiles.size())+".data") <<": " << strerror(errno);
                throw std::runtime_error("Could not open " + ("sorted_chunk_"+std::to_string(chunkfiles.size())+".data") );
            }
            readdatav.clear();
            sdglib::OutputLog()<<"dumped!"<<std::endl;
        }
    }
    if (readdatav.size()>0) {
        //sort
        std::sort(readdatav.begin(), readdatav.end());
        //dump
        std::ofstream ofile("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data");
        sdglib::OutputLog() << readdatav.size() << " pairs dumping on chunk " << chunkfiles.size() << std::endl;
        if (!ofile) {
            std::cerr << "Failed to open " << ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") <<": " << strerror(errno);
            throw std::runtime_error("Could not open " + ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") );

        }
        sdglib::OutputLog() << readdatav.size() << " pairs dumping on chunk " << chunkfiles.size() << std::endl;
        //add file to vector of files
        char buffer[2 * readsize + 2];
        for (auto &r:readdatav) {
            ofile.write((const char *) &r.tag, sizeof(r.tag));
            bzero(buffer, 2 * readsize + 2);
            memcpy(buffer, r.seq1.data(), (r.seq1.size() > readsize ? readsize : r.seq1.size()));
            memcpy(buffer + readsize + 1, r.seq2.data(), (r.seq2.size() > readsize ? readsize : r.seq2.size()));
            ofile.write(buffer, 2 * readsize + 2);
        }
        ofile.close();
        chunkfiles.emplace_back("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data");
        if (!chunkfiles.back()) {
            std::cerr << "Failed to open " << ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") <<": " << strerror(errno);
            throw std::runtime_error("Could not open " + ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data"));
        }
        readdatav.clear();
        sdglib::OutputLog() << "dumped!" << std::endl;
    }
    sdglib::OutputLog() << "performing merge from disk" << std::endl;
    //TODO: save space first for the tag index!!!
    std::ofstream output(output_filename.c_str());
    if (!output) {
        std::cerr << "Failed to open " << output_filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + output_filename);
    }

    output.write((const char *) &SDG_MAGIC, sizeof(SDG_MAGIC));
    output.write((const char *) &SDG_VN, sizeof(SDG_VN));
    SDG_FILETYPE type(LinkedDS_FT);
    output.write((char *) &type, sizeof(type));

    sdglib::write_string(output, default_name);

    output.write((const char *) &readsize,sizeof(readsize));
    read_tag.resize(pairs);
    sdglib::OutputLog() << "leaving space for " <<pairs<<" read_tag entries"<< std::endl;

    sdglib::write_flat_vector(output,read_tag);

    //multi_way merge of the chunks
    int openfiles=chunkfiles.size();
    LinkedTag next_tags[chunkfiles.size()];
    char buffer[2 * readsize + 2];
    //read a bit from each file
    for (auto i=0;i<chunkfiles.size();++i) chunkfiles[i].read((char *)&next_tags[i],sizeof(LinkedTag));
    read_tag.clear();
    while(openfiles){
        LinkedTag mintag=UINT32_MAX;
        //find the minimum tag
        for (auto &t:next_tags) if (t<mintag) mintag=t;
        //copy from each file till the next tag is > than minimum
        for (auto i=0;i<chunkfiles.size();++i){
            while (!chunkfiles[i].eof() and next_tags[i]==mintag){
                //read buffer from file and write to final file
                chunkfiles[i].read(buffer,2*readsize+2);
                output.write(buffer,2*readsize+2);
                read_tag.push_back(mintag);
                //read next tag... eof? tag=UINT32_MAX
                chunkfiles[i].read((char *)&next_tags[i],sizeof(LinkedTag));
                if (chunkfiles[i].eof()) {
                    --openfiles;
                    next_tags[i]=UINT32_MAX;
                    sdglib::OutputLog() << "chunk "<<i<<" finished"<<std::endl;
                }
            }
        }
    }

    // Write empty mapper data
    output.write((char *) &SDG_MAGIC, sizeof(SDG_MAGIC));
    output.write((char *) &SDG_VN, sizeof(SDG_VN));
    type = PairedMap_FT;
    output.write((char *) &type, sizeof(type));

    std::vector<sgNodeID_t> read_to_node;
    sdglib::write_flat_vector(output, read_to_node);
    std::vector<std::vector<ReadMapping>> reads_in_node;
    sdglib::write_flat_vectorvector(output, reads_in_node);

    // Done

    //go back to the beginning of the file and write the read_tag part again
    output.seekp(sizeof(SDG_MAGIC)+sizeof(SDG_VN)+sizeof(type)+sizeof(readsize)+sizeof(uint64_t)+(default_name.size()*sizeof(char)));
    sdglib::OutputLog() << "writing down " <<pairs<<" read_tag entries"<< std::endl;
    sdglib::write_flat_vector(output, read_tag);

    output.close();
    //delete all temporary chunk files
    for (auto &c:chunkfiles) c.close();
    for (auto i=0;i<chunkfiles.size();++i) ::unlink(("sorted_chunk_"+std::to_string(i)+".data").c_str());
    //DONE!
    sdglib::OutputLog(sdglib::LogLevels::INFO)<<"Datastore with "<<(read_tag.size())*2<<" reads, "<<tagged_reads<<" reads with tags"<<std::endl; //and "<<reads_in_tag.size()<<"tags"<<std::endl;
    gzclose(fd1);
    gzclose(fd2);
}